

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::ValidationContextImpl::getURIForPrefix(ValidationContextImpl *this,XMLCh *prefix)

{
  uint uriId;
  ulong in_RAX;
  XMLCh *pXVar1;
  bool bVar2;
  bool unknown;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  if (this->fElemStack == (ElemStack *)0x0) {
    if (this->fNamespaceScope == (NamespaceScope *)0x0) {
      uriId = 0;
    }
    else {
      uriId = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                 _vptr_XercesNamespaceResolver)();
      bVar2 = uriId == this->fNamespaceScope->fEmptyNamespaceId;
      uStack_18 = CONCAT17(bVar2,(undefined7)uStack_18);
      if (bVar2) goto LAB_002b5ca4;
    }
  }
  else {
    uriId = ElemStack::mapPrefixToURI(this->fElemStack,prefix,(bool *)((long)&uStack_18 + 7));
    if ((uStack_18 & 0x100000000000000) != 0) {
LAB_002b5ca4:
      return L"";
    }
  }
  pXVar1 = XMLScanner::getURIText(this->fScanner,uriId);
  return pXVar1;
}

Assistant:

const XMLCh* ValidationContextImpl::getURIForPrefix(XMLCh* prefix) {
    bool unknown = false;
    unsigned int uriId = 0;
    if(fElemStack)
        uriId = fElemStack->mapPrefixToURI(prefix, unknown);
    else if(fNamespaceScope)
    {
      uriId = fNamespaceScope->getNamespaceForPrefix(prefix);
      unknown = uriId == fNamespaceScope->getEmptyNamespaceId();
    }
    if (!unknown)
        return fScanner->getURIText(uriId);

    return XMLUni::fgZeroLenString;
}